

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

shared_ptr<tf::ChromeObserver> __thiscall
tf::Executor::make_observer<tf::ChromeObserver>(Executor *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<tf::ChromeObserver> sVar1;
  shared_ptr<tf::ChromeObserver> *ptr;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  ChromeObserver *in_stack_ffffffffffffff90;
  
  std::make_shared<tf::ChromeObserver>();
  std::__shared_ptr_access<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x162e0f);
  std::vector<tf::Worker,_std::allocator<tf::Worker>_>::size
            ((vector<tf::Worker,_std::allocator<tf::Worker>_> *)(in_RSI + 0x28));
  ChromeObserver::set_up
            (in_stack_ffffffffffffff90,CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)
            );
  std::static_pointer_cast<tf::ObserverInterface,tf::ChromeObserver>
            ((shared_ptr<tf::ChromeObserver> *)
             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  std::
  unordered_set<std::shared_ptr<tf::ObserverInterface>,std::hash<std::shared_ptr<tf::ObserverInterface>>,std::equal_to<std::shared_ptr<tf::ObserverInterface>>,std::allocator<std::shared_ptr<tf::ObserverInterface>>>
  ::emplace<std::shared_ptr<tf::ObserverInterface>>
            ((unordered_set<std::shared_ptr<tf::ObserverInterface>,_std::hash<std::shared_ptr<tf::ObserverInterface>_>,_std::equal_to<std::shared_ptr<tf::ObserverInterface>_>,_std::allocator<std::shared_ptr<tf::ObserverInterface>_>_>
              *)in_stack_ffffffffffffff90,
             (shared_ptr<tf::ObserverInterface> *)
             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  std::shared_ptr<tf::ObserverInterface>::~shared_ptr((shared_ptr<tf::ObserverInterface> *)0x162e89)
  ;
  sVar1.super___shared_ptr<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<tf::ChromeObserver>)
         sVar1.super___shared_ptr<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Observer> Executor::make_observer(ArgsT&&... args) {

  static_assert(
    std::is_base_of_v<ObserverInterface, Observer>,
    "Observer must be derived from ObserverInterface"
  );

  // use a local variable to mimic the constructor
  auto ptr = std::make_shared<Observer>(std::forward<ArgsT>(args)...);

  ptr->set_up(_workers.size());

  _observers.emplace(std::static_pointer_cast<ObserverInterface>(ptr));

  return ptr;
}